

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> * __thiscall
testing::internal::UnorderedElementsAreArrayMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&> *__return_storage_ptr__,
          UnorderedElementsAreArrayMatcher *this)

{
  Flags matcher_flags;
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *this_00;
  const_iterator first;
  const_iterator last;
  UnorderedElementsAreArrayMatcher<void_*> *this_local;
  
  this_00 = (UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&> *)
            operator_new(0x40);
  matcher_flags = *(Flags *)this;
  first = std::vector<void_*,_std::allocator<void_*>_>::begin
                    ((vector<void_*,_std::allocator<void_*>_> *)(this + 8));
  last = std::vector<void_*,_std::allocator<void_*>_>::end
                   ((vector<void_*,_std::allocator<void_*>_> *)(this + 8));
  UnorderedElementsAreMatcherImpl<std::vector<void*,std::allocator<void*>>const&>::
  UnorderedElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<void*const*,std::vector<void*,std::allocator<void*>>>>
            (this_00,matcher_flags,
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             first._M_current,
             (__normal_iterator<void_*const_*,_std::vector<void_*,_std::allocator<void_*>_>_>)
             last._M_current);
  Matcher<const_std::vector<void_*,_std::allocator<void_*>_>_&>::Matcher
            (__return_storage_ptr__,
             (MatcherInterface<const_std::vector<void_*,_std::allocator<void_*>_>_&> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new UnorderedElementsAreMatcherImpl<const Container&>(
            match_flags_, matchers_.begin(), matchers_.end()));
  }